

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

StringRef llvm::Triple::getEnvironmentTypeName(EnvironmentType Kind)

{
  undefined1 auStack_148 [4];
  EnvironmentType Kind_local;
  char *local_138;
  undefined1 *local_130;
  char *local_128;
  undefined1 *local_120;
  char *local_118;
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined1 *local_90;
  char *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  char *local_18;
  undefined1 *local_10;
  
  switch(Kind) {
  case UnknownEnvironment:
    local_130 = auStack_148;
    local_138 = "unknown";
    strlen("unknown");
    break;
  case GNU:
    local_120 = auStack_148;
    local_128 = "gnu";
    strlen("gnu");
    break;
  case GNUABIN32:
    local_110 = auStack_148;
    local_118 = "gnuabin32";
    strlen("gnuabin32");
    break;
  case GNUABI64:
    local_100 = auStack_148;
    local_108 = "gnuabi64";
    strlen("gnuabi64");
    break;
  case GNUEABI:
    local_e0 = auStack_148;
    local_e8 = "gnueabi";
    strlen("gnueabi");
    break;
  case GNUEABIHF:
    local_f0 = auStack_148;
    local_f8 = "gnueabihf";
    strlen("gnueabihf");
    break;
  case GNUX32:
    local_d0 = auStack_148;
    local_d8 = "gnux32";
    strlen("gnux32");
    break;
  case CODE16:
    local_c0 = auStack_148;
    local_c8 = "code16";
    strlen("code16");
    break;
  case EABI:
    local_b0 = auStack_148;
    local_b8 = "eabi";
    strlen("eabi");
    break;
  case EABIHF:
    local_a0 = auStack_148;
    local_a8 = "eabihf";
    strlen("eabihf");
    break;
  case Android:
    local_90 = auStack_148;
    local_98 = "android";
    strlen("android");
    break;
  case Musl:
    local_80 = auStack_148;
    local_88 = "musl";
    strlen("musl");
    break;
  case MuslEABI:
    local_70 = auStack_148;
    local_78 = "musleabi";
    strlen("musleabi");
    break;
  case MuslEABIHF:
    local_60 = auStack_148;
    local_68 = "musleabihf";
    strlen("musleabihf");
    break;
  case MSVC:
    local_50 = auStack_148;
    local_58 = "msvc";
    strlen("msvc");
    break;
  case Itanium:
    local_40 = auStack_148;
    local_48 = "itanium";
    strlen("itanium");
    break;
  case Cygnus:
    local_30 = auStack_148;
    local_38 = "cygnus";
    strlen("cygnus");
    break;
  case CoreCLR:
    local_20 = auStack_148;
    local_28 = "coreclr";
    strlen("coreclr");
    break;
  case LastEnvironmentType:
    local_10 = auStack_148;
    local_18 = "simulator";
    strlen("simulator");
    break;
  default:
    llvm_unreachable_internal
              ("Invalid EnvironmentType!",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0xf0);
  }
  return _auStack_148;
}

Assistant:

StringRef Triple::getEnvironmentTypeName(EnvironmentType Kind) {
  switch (Kind) {
  case UnknownEnvironment: return "unknown";
  case GNU: return "gnu";
  case GNUABIN32: return "gnuabin32";
  case GNUABI64: return "gnuabi64";
  case GNUEABIHF: return "gnueabihf";
  case GNUEABI: return "gnueabi";
  case GNUX32: return "gnux32";
  case CODE16: return "code16";
  case EABI: return "eabi";
  case EABIHF: return "eabihf";
  case Android: return "android";
  case Musl: return "musl";
  case MuslEABI: return "musleabi";
  case MuslEABIHF: return "musleabihf";
  case MSVC: return "msvc";
  case Itanium: return "itanium";
  case Cygnus: return "cygnus";
  case CoreCLR: return "coreclr";
  case Simulator: return "simulator";
  }

  llvm_unreachable("Invalid EnvironmentType!");
}